

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void __thiscall
v_hashmap<unsigned_char_*,_Search::scored_action>::put_after_get
          (v_hashmap<unsigned_char_*,_Search::scored_action> *this,uchar **key,uint64_t hash,
          scored_action *val)

{
  hash_elem *phVar1;
  hash_elem *phVar2;
  size_t sVar3;
  
  phVar1 = (this->dat)._begin;
  if ((phVar1[this->last_position].occupied == false) &&
     (phVar2 = (this->dat).end_array, sVar3 = this->num_occupants, this->num_occupants = sVar3 + 1,
     (ulong)((long)phVar2 - (long)phVar1 >> 5) <= sVar3 * 4 + 4)) {
    double_size(this);
    get(this,key,hash);
  }
  put_after_get_nogrow(this,key,hash,val);
  return;
}

Assistant:

void put_after_get(const K& key, uint64_t hash, const V& val)
  {
    if (!dat[last_position].occupied)
    {
      num_occupants++;
      if (num_occupants * 4 >= base_size())  // grow when we're a quarter full
      {
        double_size();
        get(key, hash);  // probably should change last_position-- this is the lazy man's way to do it
      }
    }

    // now actually insert it
    put_after_get_nogrow(key, hash, val);
  }